

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_twospirals.cpp
# Opt level: O3

int main(void)

{
  undefined1 *puVar1;
  long *plVar2;
  char cVar3;
  MakeNet *pMVar4;
  ostream *poVar5;
  ulong uVar6;
  long lVar7;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  string dumpfile;
  SquareAugmented SQUARE;
  Net net;
  IntClassifier classifier;
  LabeledDataset testset;
  LabeledDataset trainset;
  ofstream nnfile;
  char *local_3a0;
  long local_398;
  char local_390 [16];
  PlainTextNetworkWriter local_380;
  ADatasetTransformer local_378;
  undefined1 local_370 [16];
  pointer local_360;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_348;
  LayerType *local_340;
  pointer local_338;
  LayerType local_330 [4];
  undefined **local_320;
  MakeNet *local_318;
  vector<int,_std::allocator<int>_> local_310;
  vector<int,_std::allocator<int>_> local_2f8;
  code *local_2e0;
  undefined8 local_2d8;
  code *local_2d0;
  code *local_2c8;
  LabeledDataset local_2c0;
  LabeledDataset local_278;
  undefined1 local_230 [8];
  undefined1 local_228 [16];
  pointer pMStack_218;
  pointer local_210;
  pointer pLStack_208;
  pointer local_200;
  pointer pLStack_1f8;
  bool local_1f0;
  ios_base local_138 [264];
  
  local_2c0.nSamples._0_1_ = 0x2c;
  puVar1 = local_228 + 8;
  local_230 = (undefined1  [8])puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_230,"../datatwospirals-train.csv","");
  local_370._0_4_ = 0xffffffff;
  __l._M_len = 1;
  __l._M_array = (iterator)local_370;
  notch::core::std::vector<int,_std::allocator<int>_>::vector
            (&local_2f8,__l,(allocator_type *)&local_3a0);
  notch::io::CSVReader::read((CSVReader *)&local_278,(int)&local_2c0,local_230,(size_t)&local_2f8);
  if (local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_230 != (undefined1  [8])puVar1) {
    operator_delete((void *)local_230);
  }
  local_370[0] = 0x2c;
  local_230 = (undefined1  [8])puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_230,"../datatwospirals-test.csv","");
  local_3a0 = (char *)CONCAT44(local_3a0._4_4_,0xffffffff);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_3a0;
  notch::core::std::vector<int,_std::allocator<int>_>::vector
            (&local_310,__l_00,(allocator_type *)&local_340);
  notch::io::CSVReader::read((CSVReader *)&local_2c0,(int)local_370,local_230,(size_t)&local_310);
  if (local_310.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_310.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_230 != (undefined1  [8])puVar1) {
    operator_delete((void *)local_230);
  }
  local_378._vptr_ADatasetTransformer = (_func_int **)&PTR_apply_00128560;
  notch::core::LabeledDataset::apply(&local_278,&local_378);
  notch::core::LabeledDataset::apply(&local_2c0,&local_378);
  local_230 = (undefined1  [8])local_278.inputDimension;
  local_228._0_8_ = local_278.inputDimension;
  local_228._8_8_ = (pointer)0x0;
  pMStack_218 = (pointer)0x0;
  local_210 = (pointer)0x0;
  pLStack_208 = (pointer)0x0;
  local_200 = (pointer)0x0;
  pLStack_1f8 = (pointer)0x0;
  local_1f0 = false;
  pMVar4 = notch::core::MakeNet::addFC
                     ((MakeNet *)local_230,0x50,(Activation *)notch::core::scaledTanh);
  pMVar4 = notch::core::MakeNet::addFC(pMVar4,0x14,(Activation *)notch::core::scaledTanh);
  pMVar4 = notch::core::MakeNet::addFC(pMVar4,1,(Activation *)notch::core::scaledTanh);
  pMVar4 = notch::core::MakeNet::addLoss(pMVar4,L2Loss);
  local_2d8 = 0;
  local_2e0 = notch::core::Init::normalXavier;
  local_2c8 = notch::core::std::
              _Function_handler<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int),_void_(*)(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
              ::_M_invoke;
  local_2d0 = notch::core::std::
              _Function_handler<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int),_void_(*)(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
              ::_M_manager;
  notch::core::MakeNet::init((MakeNet *)local_370,(EVP_PKEY_CTX *)pMVar4);
  if (local_2d0 != (code *)0x0) {
    (*local_2d0)(&local_2e0,&local_2e0,3);
  }
  if (pLStack_208 != (pointer)0x0) {
    operator_delete(pLStack_208);
  }
  notch::core::std::vector<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>::~vector
            ((vector<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_> *)
             (local_228 + 8));
  local_230 = (undefined1  [8])&PTR_update_00128c08;
  local_228._0_8_ = (void *)0x358637bd3f733333;
  local_228._8_8_ = (pointer)0x0;
  pMStack_218 = (pointer)0x0;
  if (local_360 != (pointer)local_370._8_8_) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      plVar2 = *(long **)((long)(size_t *)local_370._8_8_ + lVar7);
      (**(code **)(*plVar2 + 0x70))(plVar2,local_230);
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (uVar6 < (ulong)((long)local_360 - local_370._8_8_ >> 4));
  }
  local_320 = &PTR_aslabel_00128c50;
  local_230._0_4_ = 10000;
  local_228._8_8_ = (pointer)0x0;
  local_318 = (MakeNet *)local_370;
  local_228._0_8_ = operator_new(0x20);
  *(undefined ****)local_228._0_8_ = &local_320;
  *(LabeledDataset **)(local_228._0_8_ + 8) = &local_2c0;
  *(MakeNet **)(local_228._0_8_ + 0x10) = (MakeNet *)local_370;
  *(LabeledDataset **)(local_228._0_8_ + 0x18) = &local_278;
  local_210 = (pointer)notch::core::std::
                       _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/examples/demo_twospirals.cpp:66:39)>
                       ::_M_invoke;
  pMStack_218 = (pointer)notch::core::std::
                         _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/examples/demo_twospirals.cpp:66:39)>
                         ::_M_manager;
  notch::core::SGD::train
            ((Net *)local_370,&local_278,130000,(EpochCallback *)local_230,
             (IterationCallback *)notch::core::noIterationCallback);
  if (pMStack_218 != (pointer)0x0) {
    (*(code *)pMStack_218)(local_228,local_228,3);
  }
  local_3a0 = local_390;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a0,"demo_twospirals_network.txt","");
  std::ofstream::ofstream((ostream *)local_230,(string *)&local_3a0,_S_out);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    local_380.out = (ostream *)local_230;
    notch::io::PlainTextNetworkWriter::save(&local_380,(Net *)local_370);
    local_340 = local_330;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"\n","");
    std::__ostream_insert<char,std::char_traits<char>>
              (local_380.out,(char *)local_340,(long)local_338);
    if (local_340 != local_330) {
      operator_delete(local_340);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"wrote ",6);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_3a0,local_398);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  }
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT - 0x18)) = __filebuf;
  std::filebuf::~filebuf((filebuf *)local_228);
  std::ios_base::~ios_base(local_138);
  if (local_3a0 != local_390) {
    operator_delete(local_3a0);
  }
  local_370._0_8_ = &PTR_append_001285b8;
  if (local_348._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    notch::core::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_348._M_pi);
  }
  notch::core::std::
  vector<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
  ::~vector((vector<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
             *)(local_370 + 8));
  notch::core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            (&local_2c0.outputs);
  notch::core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            (&local_2c0.inputs);
  notch::core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            (&local_278.outputs);
  notch::core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            (&local_278.inputs);
  return 0;
}

Assistant:

int main() {
    auto trainset = CSVReader().read(PATH_TO_DATA "twospirals-train.csv");
    auto testset = CSVReader().read(PATH_TO_DATA "twospirals-test.csv");

    // with SQUARE: accuracy = 99.5% (130000 epochs on 4-80-20-1 NN, ~5 min)
    // without:     accuracy = 99.5% (50000 epochs on 2-50-50-50-50-10-1 NN, ~7 min)
    SquareAugmented SQUARE;
    trainset.apply(SQUARE);
    testset.apply(SQUARE);

    Net net = MakeNet(trainset.inputDim())
        .addFC(80, scaledTanh)
        .addFC(20, scaledTanh)
        .addFC(1, scaledTanh)
        .addL2Loss()
        .init();

    net.setLearningPolicy(AdaDelta());

    auto classifier = IntClassifier(net);

    SGD::train(net, trainset,
               130000 /* epochs */,
               EpochCallback { 10000, [&](int i) {
                   auto cm = classifier.test(testset); // confusion matrix
                   cout << "epoch "
                        << setw(6) << i << " "
                        << " train loss = "
                        << setprecision(3) << setw(5) << showpoint
                        << meanLoss(net, trainset)
                        << " test loss = "
                        << setprecision(3) << setw(5) << showpoint
                        << meanLoss(net, testset)
                        << " accuracy = "
                        << setprecision(3) << setw(5) << showpoint
                        << cm.accuracy()
                        << " F1 = "
                        << setprecision(3) << setw(5) << showpoint
                        << cm.F1score()
                        << endl;
                   return false;
               }});

    string dumpfile = "demo_twospirals_network.txt";
    ofstream nnfile(dumpfile);
    if (nnfile.is_open()) {
        PlainTextNetworkWriter(nnfile) << net << "\n";
        cout << "wrote " << dumpfile << "\n";
    }
}